

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

bool __thiscall
XipFile::extractfile(XipFile *this,string *romname,string *dstpath,filetypefilter_ptr *filter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  reference ppVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined8 uVar6;
  FileReader *__p;
  element_type *this_01;
  uint64_t t;
  byte local_c1;
  undefined1 local_b0 [8];
  shared_ptr<FileReader> dstfile;
  undefined1 local_88 [8];
  ReadWriter_ptr w;
  shared_ptr<ReadWriter> local_60;
  undefined1 local_50 [8];
  XipEntry_ptr srcfile;
  _Self local_38;
  iterator fi;
  filetypefilter_ptr *filter_local;
  string *dstpath_local;
  string *romname_local;
  XipFile *this_local;
  
  fi._M_node = (_Base_ptr)filter;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::find(&this->_files,romname);
  srcfile.super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::end(&this->_files);
  bVar1 = std::operator==(&local_38,
                          (_Self *)&srcfile.
                                    super___shared_ptr<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (bVar1) {
    uVar6 = std::__cxx11::string::c_str();
    printf("extract: %s not found\n",uVar6);
    this_local._7_1_ = false;
  }
  else {
    if (g_verbose != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
               ::operator*(&local_38);
      peVar4 = std::__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ppVar3->second);
      XipEntry::listentry(peVar4,this);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
             ::operator*(&local_38);
    std::shared_ptr<XipFile::XipEntry>::shared_ptr
              ((shared_ptr<XipFile::XipEntry> *)local_50,&ppVar3->second);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)filter);
    local_c1 = 0;
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<filetypefilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<filetypefilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)filter);
      peVar4 = std::__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      (*peVar4->_vptr_XipEntry[6])(&local_60,peVar4,this);
      iVar2 = (*peVar5->_vptr_filetypefilter[2])(peVar5,&local_60);
      local_c1 = (byte)iVar2 ^ 0xff;
      std::shared_ptr<ReadWriter>::~shared_ptr(&local_60);
    }
    if ((local_c1 & 1) == 0) {
      __p = (FileReader *)operator_new(0x40);
      FileReader::FileReader(__p,dstpath);
      std::shared_ptr<ReadWriter>::shared_ptr<FileReader,void>
                ((shared_ptr<ReadWriter> *)local_88,__p);
      peVar4 = std::__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      this_00 = &dstfile.super___shared_ptr<FileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<ReadWriter>::shared_ptr
                ((shared_ptr<ReadWriter> *)this_00,(shared_ptr<ReadWriter> *)local_88);
      (*peVar4->_vptr_XipEntry[4])(peVar4,this,this_00);
      std::shared_ptr<ReadWriter>::~shared_ptr
                ((shared_ptr<ReadWriter> *)
                 &dstfile.super___shared_ptr<FileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::dynamic_pointer_cast<FileReader,ReadWriter>((shared_ptr<ReadWriter> *)local_b0);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
      if (bVar1) {
        this_01 = std::__shared_ptr_access<FileReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<FileReader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b0);
        peVar4 = std::
                 __shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
        t = XipEntry::getunixtime(peVar4);
        FileReader::setunixtime(this_01,t);
      }
      this_local._7_1_ = true;
      w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      std::shared_ptr<FileReader>::~shared_ptr((shared_ptr<FileReader> *)local_b0);
      std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_88);
    }
    else {
      if (1 < g_verbose) {
        uVar6 = std::__cxx11::string::c_str();
        printf("filtered %s\n",uVar6);
      }
      this_local._7_1_ = false;
      w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    }
    std::shared_ptr<XipFile::XipEntry>::~shared_ptr((shared_ptr<XipFile::XipEntry> *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool extractfile(const std::string&romname, const std::string& dstpath, filetypefilter_ptr filter)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("extract: %s not found\n", romname.c_str());
            return false;
        }

        if (g_verbose)
            (*fi).second->listentry(*this);

        XipEntry_ptr srcfile= (*fi).second;
        if (filter && !filter->match(srcfile->getdatareader(*this))) {
            if (g_verbose > 1)
                printf("filtered %s\n", romname.c_str());
            return false;
        }

        ReadWriter_ptr w(new FileReader(dstpath, FileReader::createnew));

        srcfile->tostream(*this, w);

        std::shared_ptr<FileReader> dstfile= std::dynamic_pointer_cast<FileReader>(w);
        if (dstfile) {
            try {
            dstfile->setunixtime(srcfile->getunixtime());
            }
            catch(...)
            {
                printf("xip.get: error setting filetime\n");
            }
        }
        return true;
    }